

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::FunctionBinder::BindFunctionFromArguments<duckdb::PragmaFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::PragmaFunction> *functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  pointer pLVar1;
  reference pvVar2;
  ParameterNotResolvedException *this_00;
  vector<unsigned_long,_true> candidate_functions;
  optional_idx local_50;
  vector<unsigned_long,_true> local_48;
  
  BindFunctionsFromArguments<duckdb::PragmaFunction>(&local_48,this,name,functions,arguments,error);
  if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50.index = 0xffffffffffffffff;
  }
  else if ((ulong)((long)local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) < 9) {
    pvVar2 = vector<unsigned_long,_true>::operator[](&local_48,0);
    optional_idx::optional_idx(&local_50,*pvVar2);
  }
  else {
    for (pLVar1 = (arguments->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pLVar1 != (arguments->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pLVar1 = pLVar1 + 1) {
      if (pLVar1->id_ == UNKNOWN) {
        this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_00);
        __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
    }
    local_50 = MultipleCandidateException<duckdb::PragmaFunction>
                         (this,name,functions,&local_48,arguments,error);
  }
  if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (optional_idx)local_50.index;
}

Assistant:

optional_idx FunctionBinder::BindFunctionFromArguments(const string &name, FunctionSet<T> &functions,
                                                       const vector<LogicalType> &arguments, ErrorData &error) {
	auto candidate_functions = BindFunctionsFromArguments<T>(name, functions, arguments, error);
	if (candidate_functions.empty()) {
		// no candidates
		return optional_idx();
	}
	if (candidate_functions.size() > 1) {
		// multiple candidates, check if there are any unknown arguments
		bool has_parameters = false;
		for (auto &arg_type : arguments) {
			if (arg_type.id() == LogicalTypeId::UNKNOWN) {
				//! there are! we could not resolve parameters in this case
				throw ParameterNotResolvedException();
			}
		}
		if (!has_parameters) {
			return MultipleCandidateException(name, functions, candidate_functions, arguments, error);
		}
	}
	return candidate_functions[0];
}